

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O0

void PPrintScriptStyle(TidyDocImpl *doc,uint mode,uint indent,Node *node)

{
  int iVar1;
  Bool BVar2;
  int iVar3;
  uint uVar4;
  TidyPrintImpl *pprint_00;
  AttVal *pAVar5;
  uint saveWrap_1;
  uint saveWrap;
  AttVal *type;
  int local_48;
  Bool xhtmlOut;
  int contentIndent;
  Bool hasCData;
  ctmbstr commentEnd;
  ctmbstr commentStart;
  Node *content;
  TidyPrintImpl *pprint;
  Node *node_local;
  uint indent_local;
  uint mode_local;
  TidyDocImpl *doc_local;
  
  pprint_00 = &doc->pprint;
  commentEnd = DEFAULT_COMMENT_START;
  _contentIndent = DEFAULT_COMMENT_END;
  xhtmlOut = no;
  local_48 = -1;
  iVar1 = (int)(doc->config).value[0x62].v;
  BVar2 = InsideHead(doc,node);
  if (BVar2 != no) {
    prvTidyPFlushLineSmart(doc,indent);
  }
  PCondFlushLineSmart(doc,indent);
  PPrintTag(doc,mode,indent,node);
  if (node->content != (Node *)0x0) {
    prvTidyPFlushLineSmart(doc,indent);
  }
  if ((iVar1 != 0) && (node->content != (Node *)0x0)) {
    pAVar5 = prvTidyAttrGetById(node,TidyAttr_TYPE);
    if ((pAVar5 == (AttVal *)0x0) ||
       ((pAVar5->value == (tmbstr)0x0 ||
        (iVar3 = prvTidytmbstrcasecmp(pAVar5->value,"text/javascript"), iVar3 != 0)))) {
      if ((pAVar5 == (AttVal *)0x0) ||
         ((pAVar5->value == (tmbstr)0x0 ||
          (iVar3 = prvTidytmbstrcasecmp(pAVar5->value,"text/css"), iVar3 != 0)))) {
        if ((pAVar5 != (AttVal *)0x0) &&
           ((pAVar5->value != (tmbstr)0x0 &&
            (iVar3 = prvTidytmbstrcasecmp(pAVar5->value,"text/vbscript"), iVar3 == 0)))) {
          commentEnd = VB_COMMENT_START;
          _contentIndent = VB_COMMENT_END;
        }
      }
      else {
        commentEnd = CSS_COMMENT_START;
        _contentIndent = CSS_COMMENT_END;
      }
    }
    else {
      commentEnd = JS_COMMENT_START;
      _contentIndent = JS_COMMENT_END;
    }
    xhtmlOut = HasCDATA(doc->lexer,node->content);
    if (xhtmlOut == no) {
      uVar4 = WrapOff(doc);
      AddString(pprint_00,commentEnd);
      AddString(pprint_00,CDATA_START);
      AddString(pprint_00,_contentIndent);
      PCondFlushLineSmart(doc,indent);
      WrapOn(doc,uVar4);
    }
  }
  for (commentStart = (ctmbstr)node->content; commentStart != (ctmbstr)0x0;
      commentStart = *(ctmbstr *)(commentStart + 0x10)) {
    prvTidyPPrintTree(doc,mode | 0x19,indent,(Node *)commentStart);
    if ((Node *)commentStart == node->last) {
      local_48 = TextEndsWithNewline(doc->lexer,(Node *)commentStart,0x10);
    }
  }
  if ((local_48 < 0) && (node->content != (Node *)0x0)) {
    PCondFlushLineSmart(doc,indent);
  }
  if (((iVar1 != 0) && (node->content != (Node *)0x0)) && (xhtmlOut == no)) {
    uVar4 = WrapOff(doc);
    AddString(pprint_00,commentEnd);
    AddString(pprint_00,CDATA_END);
    AddString(pprint_00,_contentIndent);
    WrapOn(doc,uVar4);
    PCondFlushLineSmart(doc,indent);
  }
  if ((node->content != (Node *)0x0) && ((doc->pprint).indent[0].spaces != indent)) {
    (doc->pprint).indent[0].spaces = indent;
  }
  PPrintEndTag(doc,mode,indent,node);
  if ((((int)(doc->config).value[0x25].v == 0) && (node->next != (Node *)0x0)) &&
     ((BVar2 = prvTidynodeHasCM(node,0x10), BVar2 == no &&
      (BVar2 = prvTidynodeIsText(node), BVar2 == no)))) {
    prvTidyPFlushLineSmart(doc,indent);
  }
  return;
}

Assistant:

static
void PPrintScriptStyle( TidyDocImpl* doc, uint mode, uint indent, Node *node )
{
    TidyPrintImpl* pprint = &doc->pprint;
    Node*   content;
    ctmbstr commentStart = DEFAULT_COMMENT_START;
    ctmbstr commentEnd = DEFAULT_COMMENT_END;
    Bool    hasCData = no;
    int     contentIndent = -1;
    Bool    xhtmlOut = cfgBool( doc, TidyXhtmlOut );

    if ( InsideHead(doc, node) )
      TY_(PFlushLineSmart)( doc, indent );

    PCondFlushLineSmart( doc, indent );  /* Issue #56 - long oustanding bug - flush any existing closing tag */

    PPrintTag( doc, mode, indent, node );

    /* SCRIPT may have no content such as when loading code via its SRC attribute.
       In this case we don't want to flush the line, preferring to keep the required
       closing SCRIPT tag on the same line. */
    if ( node->content != NULL )
        TY_(PFlushLineSmart)(doc, indent);

    if ( xhtmlOut && node->content != NULL )
    {
        AttVal* type = attrGetTYPE(node);

        if (AttrValueIs(type, "text/javascript"))
        {
            commentStart = JS_COMMENT_START;
            commentEnd = JS_COMMENT_END;
        }
        else if (AttrValueIs(type, "text/css"))
        {
            commentStart = CSS_COMMENT_START;
            commentEnd = CSS_COMMENT_END;
        }
        else if (AttrValueIs(type, "text/vbscript"))
        {
            commentStart = VB_COMMENT_START;
            commentEnd = VB_COMMENT_END;
        }

        hasCData = HasCDATA(doc->lexer, node->content);

        if (!hasCData)
        {
            uint saveWrap = WrapOff( doc );

            AddString( pprint, commentStart );
            AddString( pprint, CDATA_START );
            AddString( pprint, commentEnd );
            PCondFlushLineSmart( doc, indent );

            WrapOn( doc, saveWrap );
        }
    }

    for ( content = node->content;
          content != NULL;
          content = content->next )
    {
        /*
          This is a bit odd, with the current code there can only
          be one child and the only caller of this function defines
          all these modes already...
        */
        TY_(PPrintTree)( doc, (mode | PREFORMATTED | NOWRAP | CDATA), 
                         indent, content );

        if ( content == node->last )
            contentIndent = TextEndsWithNewline( doc->lexer, content, CDATA );
    }

    /* Only flush the line if these was content present so that the closing
       SCRIPT tag will stay on the same line. */
    if ( contentIndent < 0 && node->content != NULL )
    {
        PCondFlushLineSmart( doc, indent );
        contentIndent = 0;
    }

    if ( xhtmlOut && node->content != NULL )
    {
        if ( ! hasCData )
        {
            uint saveWrap = WrapOff( doc );

            AddString( pprint, commentStart );
            AddString( pprint, CDATA_END );
            AddString( pprint, commentEnd );

            WrapOn( doc, saveWrap );
            PCondFlushLineSmart( doc, indent );
        }
    }

    if ( node->content && pprint->indent[ 0 ].spaces != (int)indent )
    {
#if defined(ENABLE_DEBUG_LOG) && defined(DEBUG_INDENT)
        SPRTF("%s Indent from %d to %d\n", __FUNCTION__, pprint->indent[ 0 ].spaces, indent );
#endif  
        pprint->indent[ 0 ].spaces = indent;
    }
    PPrintEndTag( doc, mode, indent, node );
    if ( cfgAutoBool(doc, TidyIndentContent) == TidyNoState
         && node->next != NULL &&
         !( TY_(nodeHasCM)(node, CM_INLINE) || TY_(nodeIsText)(node) ) )
        TY_(PFlushLineSmart)( doc, indent );
}